

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_get_bits(stbi__jpeg *j,int n)

{
  int in_ESI;
  stbi__jpeg *in_RDI;
  uint k;
  uint local_4;
  
  if (in_RDI->code_bits < in_ESI) {
    stbi__grow_buffer_unsafe(in_RDI);
  }
  if (in_RDI->code_bits < in_ESI) {
    local_4 = 0;
  }
  else {
    local_4 = in_RDI->code_buffer << ((byte)in_ESI & 0x1f) |
              in_RDI->code_buffer >> (-(byte)in_ESI & 0x1f);
    in_RDI->code_buffer = local_4 & (stbi__bmask[in_ESI] ^ 0xffffffff);
    local_4 = stbi__bmask[in_ESI] & local_4;
    in_RDI->code_bits = in_RDI->code_bits - in_ESI;
  }
  return local_4;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bits(stbi__jpeg *j, int n)
{
   unsigned int k;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < n) return 0; // ran out of bits from stream, return 0s intead of continuing
   k = stbi_lrot(j->code_buffer, n);
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k;
}